

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O1

int ncnn::convolution(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                     int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,
                     int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  pointer piVar5;
  uint uVar6;
  uint extraout_EAX;
  uint uVar7;
  uint extraout_EAX_00;
  int iVar8;
  void *pvVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  Mat *pMVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  vector<int,_std::allocator<int>_> _space_ofs;
  allocator_type local_f1;
  Mat *local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  Mat *local_d0;
  float *local_c8;
  int local_bc;
  ulong local_b8;
  ulong local_b0;
  long local_a8;
  void *local_a0;
  Mat *local_98;
  long local_90;
  Mat *local_88;
  void *local_80;
  long local_78;
  void *local_70;
  long local_68;
  ulong local_60;
  undefined1 local_58 [16];
  vector<int,_std::allocator<int>_> local_48;
  
  local_b8 = (ulong)(uint)top_blob->c;
  if (bias_data->data == (void *)0x0) {
    bVar16 = true;
  }
  else {
    bVar16 = (long)bias_data->c * bias_data->cstep == 0;
  }
  iVar2 = bottom_blob->w;
  uVar3 = bottom_blob->c;
  iVar4 = top_blob->w;
  local_b0 = (ulong)(uint)top_blob->h;
  uVar6 = kernel_h * kernel_w;
  local_f0 = top_blob;
  local_d0 = bottom_blob;
  local_98 = weight_data;
  local_88 = bias_data;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)(int)uVar6,&local_f1);
  piVar5 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar7 = extraout_EAX;
  if (0 < kernel_h) {
    iVar8 = 0;
    iVar10 = 0;
    iVar12 = 0;
    do {
      if (0 < kernel_w) {
        lVar13 = 0;
        do {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar8 + lVar13] = iVar12;
          iVar12 = iVar12 + dilation_w;
          lVar13 = lVar13 + 1;
        } while (kernel_w != (int)lVar13);
        iVar8 = iVar8 + (int)lVar13;
      }
      iVar12 = iVar12 + (iVar2 * dilation_h - dilation_w * kernel_w);
      iVar10 = iVar10 + 1;
      uVar7 = dilation_w;
    } while (iVar10 != kernel_h);
  }
  if (0 < (int)local_b8) {
    local_a0 = local_f0->data;
    local_78 = (long)stride_w;
    local_90 = (long)stride_h;
    local_a8 = local_f0->cstep * local_f0->elemsize;
    local_bc = kernel_h * uVar3 * kernel_w;
    local_e0 = 0;
    local_60 = (ulong)(activation_type - 1);
    local_e8 = 0;
    pMVar15 = local_d0;
    do {
      if (0 < (int)local_b0) {
        local_f0 = (Mat *)(local_a8 * local_e8 + (long)local_a0);
        local_70 = (void *)((long)(int)local_e0 * 4 + (long)local_98->data);
        local_d8 = 0;
        do {
          if (0 < iVar4) {
            local_80 = local_88->data;
            local_68 = local_d8 * local_90 * (long)pMVar15->w;
            local_c8 = (float *)activation_params->data;
            lVar13 = 0;
            do {
              fVar18 = 0.0;
              if (!bVar16) {
                fVar18 = *(float *)((long)local_80 + local_e8 * 4);
              }
              if (0 < (int)uVar3) {
                uVar11 = 0;
                pvVar9 = local_70;
                do {
                  if (0 < (int)uVar6) {
                    uVar14 = 0;
                    do {
                      fVar18 = fVar18 + *(float *)((long)pvVar9 + uVar14 * 4) *
                                        *(float *)((long)pMVar15->data +
                                                  (long)piVar5[uVar14] * 4 +
                                                  pMVar15->cstep * pMVar15->elemsize * uVar11 +
                                                  lVar13 * local_78 * 4 +
                                                  pMVar15->elemsize * local_68);
                      uVar14 = uVar14 + 1;
                    } while (uVar6 != uVar14);
                  }
                  uVar11 = uVar11 + 1;
                  pvVar9 = (void *)((long)pvVar9 + (long)(int)uVar6 * 4);
                } while (uVar11 != uVar3);
              }
              fVar19 = fVar18;
              if ((uint)local_60 < 6) {
                switch((long)&switchD_0016c222::switchdataD_00318398 +
                       (long)(int)(&switchD_0016c222::switchdataD_00318398)[local_60]) {
                case 0x16c224:
                  if (fVar18 <= 0.0) {
                    fVar19 = 0.0;
                  }
                  break;
                case 0x16c22e:
                  local_58 = ZEXT416((uint)fVar18);
                  fVar18 = expf(fVar18);
                  fVar18 = logf(fVar18 + 1.0);
                  fVar18 = tanhf(fVar18);
                  pMVar15 = local_d0;
                  fVar19 = fVar18 * (float)local_58._0_4_;
                  break;
                case 0x16c265:
                  if (fVar18 <= *local_c8) {
                    fVar18 = *local_c8;
                  }
                  fVar19 = fVar18;
                  if (local_c8[1] <= fVar18) {
                    fVar19 = local_c8[1];
                  }
                  break;
                case 0x16c278:
                  fVar18 = expf(-fVar18);
                  pMVar15 = local_d0;
                  fVar19 = 1.0 / (fVar18 + 1.0);
                  break;
                case 0x16c2a6:
                  fVar19 = (float)(~-(uint)(0.0 < fVar18) & (uint)*local_c8 |
                                  -(uint)(0.0 < fVar18) & 0x3f800000) * fVar18;
                  break;
                case 0x16c2ed:
                  fVar1 = *local_c8;
                  fVar17 = -local_c8[1] / fVar1;
                  fVar19 = 0.0;
                  if ((fVar17 <= fVar18) && (fVar19 = fVar18, fVar18 <= fVar17 + 1.0 / fVar1)) {
                    fVar19 = (fVar1 * fVar18 + local_c8[1]) * fVar18;
                  }
                }
              }
              *(float *)((long)&local_f0->data + lVar13 * 4) = fVar19;
              lVar13 = lVar13 + 1;
            } while (lVar13 != iVar4);
          }
          local_f0 = (Mat *)((long)&local_f0->data + (long)iVar4 * 4);
          local_d8 = local_d8 + 1;
        } while (local_d8 != local_b0);
      }
      local_e8 = local_e8 + 1;
      uVar7 = (int)local_e0 + local_bc;
      local_e0 = (ulong)uVar7;
    } while (local_e8 != local_b8);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    uVar7 = extraout_EAX_00;
  }
  return uVar7;
}

Assistant:

static int convolution(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int bias_term = bias_data.empty() ? 0 : 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * inch * p;

                for (int q = 0; q < inch; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[space_ofs[k]]; // 20.72
                        float wt = kptr[k];
                        sum += val * wt; // 41.45
                    }

                    kptr += maxk;
                }

                outptr[j] = activation_ss(sum, activation_type, activation_params);
            }

            outptr += outw;
        }
    }

    return 0;
}